

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlGetMaxOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  xmlNodePtr node_00;
  byte *str1;
  byte *pbVar4;
  xmlChar *unaff_RBX;
  ulong uVar5;
  int iVar6;
  undefined4 in_register_00000084;
  xmlChar *in_stack_ffffffffffffffc8;
  
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"maxOccurs");
  if ((node_00 != (xmlNodePtr)0x0) &&
     (str1 = xmlSchemaGetNodeContent(ctxt,node_00), str1 != (byte *)0x0)) {
    iVar3 = xmlStrEqual(str1,"unbounded");
    pbVar2 = str1;
    if (iVar3 == 0) {
      do {
        pbVar4 = pbVar2 + 1;
        uVar5 = (ulong)*pbVar2;
        if (0x20 < uVar5) goto LAB_00192dbe;
        pbVar2 = pbVar4;
      } while ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0);
      if (uVar5 != 0) {
LAB_00192dbe:
        iVar3 = 0;
        while ((byte)((char)uVar5 - 0x30U) < 10) {
          iVar6 = 0x7fffffff;
          if ((iVar3 < 0xccccccd) &&
             (iVar6 = iVar3 * 10 + -0x30 + (int)uVar5, -0x7fffffd1 - (int)uVar5 < iVar3 * 10)) {
            iVar6 = 0x7fffffff;
          }
          bVar1 = *pbVar4;
          pbVar4 = pbVar4 + 1;
          iVar3 = iVar6;
          uVar5 = (ulong)bVar1;
        }
        while ((byte)uVar5 < 0x21) {
          if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
            if ((uVar5 == 0) && (min <= iVar3 && iVar3 <= max)) {
              return iVar3;
            }
            break;
          }
          bVar1 = *pbVar4;
          pbVar4 = pbVar4 + 1;
          uVar5 = (ulong)bVar1;
        }
      }
    }
    else if (max == 0x40000000) {
      return 0x40000000;
    }
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)node_00,
               (xmlNodePtr)0x0,(xmlSchemaTypePtr)CONCAT44(in_register_00000084,def),(char *)str1,
               (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffc8,unaff_RBX);
  }
  return 1;
}

Assistant:

static int
xmlGetMaxOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "maxOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (val == NULL)
        return (def);

    if (xmlStrEqual(val, (const xmlChar *) "unbounded")) {
	if (max != UNBOUNDED) {
	    xmlSchemaPSimpleTypeErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		/* XML_SCHEMAP_INVALID_MINOCCURS, */
		NULL, (xmlNodePtr) attr, NULL, expected,
		val, NULL, NULL, NULL);
	    return (def);
	} else
	    return (UNBOUNDED);  /* encoding it with -1 might be another option */
    }

    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
	return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}